

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_Snapshot::_Run(_Test_Snapshot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DB *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 local_251;
  string local_250;
  string local_230;
  Snapshot *local_210;
  Snapshot *local_208;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  void *local_1f0;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  char *local_1d0;
  char *pcStack_1c8;
  char local_1c0 [8];
  stringstream local_1b8 [392];
  
  paVar1 = &local_230.field_2;
  while( true ) {
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"foo","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"v1","");
    pDVar2 = (this->super_DBTest).db_;
    local_251 = 0;
    local_230._M_dataplus._M_p = local_1d0;
    local_230._M_string_length = (size_type)pcStack_1c8;
    local_200 = local_250._M_dataplus._M_p._0_4_;
    uStack_1fc = local_250._M_dataplus._M_p._4_4_;
    uStack_1f8 = (undefined4)local_250._M_string_length;
    uStack_1f4 = local_250._M_string_length._4_4_;
    (*pDVar2->_vptr_DB[2])(&local_1d8,pDVar2,&local_251,&local_230,&local_200);
    if (local_1d8 != (void *)0x0) {
      operator_delete__(local_1d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_208 = (Snapshot *)CONCAT44(extraout_var,iVar3);
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"foo","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"v2","");
    pDVar2 = (this->super_DBTest).db_;
    local_251 = 0;
    local_230._M_dataplus._M_p = local_1d0;
    local_230._M_string_length = (size_type)pcStack_1c8;
    local_200 = local_250._M_dataplus._M_p._0_4_;
    uStack_1fc = local_250._M_dataplus._M_p._4_4_;
    uStack_1f8 = (undefined4)local_250._M_string_length;
    uStack_1f4 = local_250._M_string_length._4_4_;
    (*pDVar2->_vptr_DB[2])(&local_1e0,pDVar2,&local_251,&local_230,&local_200);
    if (local_1e0 != (void *)0x0) {
      operator_delete__(local_1e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_210 = (Snapshot *)CONCAT44(extraout_var_00,iVar3);
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"foo","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"v3","");
    pDVar2 = (this->super_DBTest).db_;
    local_251 = 0;
    local_230._M_dataplus._M_p = local_1d0;
    local_230._M_string_length = (size_type)pcStack_1c8;
    local_200 = local_250._M_dataplus._M_p._0_4_;
    uStack_1fc = local_250._M_dataplus._M_p._4_4_;
    uStack_1f8 = (undefined4)local_250._M_string_length;
    uStack_1f4 = local_250._M_string_length._4_4_;
    (*pDVar2->_vptr_DB[2])(&local_1e8,pDVar2,&local_251,&local_230,&local_200);
    if (local_1e8 != (void *)0x0) {
      operator_delete__(local_1e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"foo","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"v4","");
    pDVar2 = (this->super_DBTest).db_;
    local_251 = 0;
    local_230._M_dataplus._M_p = local_1d0;
    local_230._M_string_length = (size_type)pcStack_1c8;
    local_200 = local_250._M_dataplus._M_p._0_4_;
    uStack_1fc = local_250._M_dataplus._M_p._4_4_;
    uStack_1f8 = (undefined4)local_250._M_string_length;
    uStack_1f4 = local_250._M_string_length._4_4_;
    (*pDVar2->_vptr_DB[2])(&local_1f0,pDVar2,&local_251,&local_230,&local_200);
    if (local_1f0 != (void *)0x0) {
      operator_delete__(local_1f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '\x19';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,local_208);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v1",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '\x1a';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,local_210);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v2",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '\x1b';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,
                (Snapshot *)CONCAT44(extraout_var_01,iVar3));
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v3",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '\x1c';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v4",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[8])(pDVar2,(Snapshot *)CONCAT44(extraout_var_01,iVar3));
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '\x1f';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,local_208);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v1",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = ' ';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,local_210);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v2",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '!';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v4",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[8])(pDVar2,local_208);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '$';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,local_210);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v2",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '%';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v4",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[8])(pDVar2,local_210);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0[0] = '(';
    local_1c0[1] = '\x05';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    DBTest::Get(&local_250,&this->super_DBTest,&local_230,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v4",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    iVar3 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar3 + 1;
    if (2 < iVar3) break;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  }
  return;
}

Assistant:

TEST(DBTest, Snapshot) {
  do {
    Put("foo", "v1");
    const Snapshot* s1 = db_->GetSnapshot();
    Put("foo", "v2");
    const Snapshot* s2 = db_->GetSnapshot();
    Put("foo", "v3");
    const Snapshot* s3 = db_->GetSnapshot();

    Put("foo", "v4");
    ASSERT_EQ("v1", Get("foo", s1));
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v3", Get("foo", s3));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s3);
    ASSERT_EQ("v1", Get("foo", s1));
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s1);
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s2);
    ASSERT_EQ("v4", Get("foo"));
  } while (ChangeOptions());
}